

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O0

void ht_add(htable *ht,void *new,size_t h)

{
  _Bool _Var1;
  uintptr_t uVar2;
  ulong local_30;
  uintptr_t perfect;
  size_t i;
  size_t h_local;
  void *new_local;
  htable *ht_local;
  
  local_30 = ht->perfect_bit;
  perfect = hash_bucket(ht,h);
  while( true ) {
    _Var1 = entry_is_valid(ht->table[perfect]);
    if (!_Var1) break;
    local_30 = 0;
    perfect = perfect + 1 & (long)((1 << ((byte)ht->bits & 0x1f)) + -1);
  }
  uVar2 = get_hash_ptr_bits(ht,h);
  uVar2 = make_hval(ht,new,uVar2 | local_30);
  ht->table[perfect] = uVar2;
  return;
}

Assistant:

static void ht_add(struct htable *ht, const void *new, size_t h)
{
	size_t i;
	uintptr_t perfect = ht->perfect_bit;

	i = hash_bucket(ht, h);

	while (entry_is_valid(ht->table[i])) {
		perfect = 0;
		i = (i + 1) & ((1 << ht->bits)-1);
	}
	ht->table[i] = make_hval(ht, new, get_hash_ptr_bits(ht, h)|perfect);
}